

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O2

void __thiscall adios2::transport::FileFStream::Seek(FileFStream *this,size_t start)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if (start != 0xffffffffffffffff) {
    WaitForOpen(this);
    std::ostream::seekp((long)&this->field_0x100,(_Ios_Seekdir)start);
    std::__cxx11::to_string(&local_38,start);
    std::operator+(&bStack_b8,"couldn\'t move to offset ",&local_38);
    std::operator+(&local_98,&bStack_b8," of file ");
    std::operator+(&local_78,&local_98,&(this->super_Transport).m_Name);
    std::operator+(&local_58,&local_78,", in call to fstream seekp");
    CheckFile(this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&bStack_b8);
    std::__cxx11::string::~string((string *)&local_38);
    return;
  }
  SeekToEnd(this);
  return;
}

Assistant:

void FileFStream::Seek(const size_t start)
{
    if (start != MaxSizeT)
    {
        WaitForOpen();
        m_FileStream.seekp(start, std::ios_base::beg);
        CheckFile("couldn't move to offset " + std::to_string(start) + " of file " + m_Name +
                  ", in call to fstream seekp");
    }
    else
    {
        SeekToEnd();
    }
}